

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void __thiscall TC_parser<false>::maybeFeature(TC_parser<false> *this)

{
  char cVar1;
  size_t sVar2;
  example *peVar3;
  v_hashmap<substring,_features_*> *this_00;
  features *pfVar4;
  unsigned_long *_begin;
  substring sVar5;
  uint64_t uVar6;
  feature_index i;
  uint64_t uVar7;
  pointer ppvVar8;
  features **ppfVar9;
  pointer ppvVar10;
  float *pfVar12;
  float *_begin_00;
  size_t dict;
  ulong uVar13;
  char *c;
  char *pcVar14;
  float fVar15;
  substring sVar16;
  char d;
  substring feature_name;
  char local_45;
  float local_44;
  substring local_40;
  char *pcVar11;
  
  cVar1 = *this->reading_head;
  if ((((cVar1 != '\t') && (cVar1 != ' ')) && (cVar1 != '|')) &&
     ((cVar1 != '\r' && (this->reading_head != this->endLine)))) {
    sVar16 = read_name(this);
    pcVar11 = sVar16.end;
    pcVar14 = sVar16.begin;
    local_44 = this->cur_channel_v;
    local_40 = sVar16;
    fVar15 = featureValue(this);
    fVar15 = fVar15 * local_44;
    this->v = fVar15;
    if (pcVar11 == pcVar14) {
      sVar2 = this->anon;
      this->anon = sVar2 + 1;
      i = sVar2 + this->channel_hash;
    }
    else {
      uVar6 = (*this->p->hasher)(sVar16,this->channel_hash);
      i = uVar6 & this->parse_mask;
      fVar15 = this->v;
    }
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      features::push_back((this->ae->super_example_predict).feature_space + this->index,fVar15,i);
      uVar13 = (ulong)this->index;
      uVar6 = this->affix_features[uVar13];
      if (uVar6 != 0 && pcVar11 != pcVar14) {
        peVar3 = this->ae;
        if ((peVar3->super_example_predict).feature_space[0x84].values._end ==
            (peVar3->super_example_predict).feature_space[0x84].values._begin) {
          v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar3,&affix_namespace);
          uVar6 = this->affix_features[this->index];
        }
        for (; uVar6 != 0; uVar6 = uVar6 >> 4) {
          uVar13 = (ulong)((uint)(uVar6 >> 1) & 7);
          sVar5 = sVar16;
          if ((pcVar14 + uVar13 < pcVar11) &&
             (sVar5.end = pcVar14 + uVar13, sVar5.begin = pcVar14, (uVar6 & 1) == 0)) {
            sVar5.end = pcVar11;
            sVar5.begin = pcVar11 + -uVar13;
          }
          uVar7 = (*this->p->hasher)(sVar5,this->channel_hash);
          features::push_back((peVar3->super_example_predict).feature_space + 0x84,this->v,
                              ((ulong)((uint)uVar6 & 0xf) * 0x1aa5cfd + 0xd42855) * uVar7);
        }
        uVar13 = (ulong)this->index;
      }
      if (this->spelling_features[uVar13] == true) {
        peVar3 = this->ae;
        if ((peVar3->super_example_predict).feature_space[0x85].values._end ==
            (peVar3->super_example_predict).feature_space[0x85].values._begin) {
          v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar3,&spelling_namespace);
        }
        v_array<char>::clear(&this->spelling);
        for (; pcVar14 != pcVar11; pcVar14 = pcVar14 + 1) {
          cVar1 = *pcVar14;
          if ((byte)(cVar1 - 0x30U) < 10) {
            local_45 = '0';
          }
          else if ((byte)(cVar1 + 0x9fU) < 0x1a) {
            local_45 = 'a';
          }
          else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            local_45 = 'A';
          }
          else if (cVar1 == '.') {
            local_45 = '.';
          }
          else {
            local_45 = '#';
          }
          v_array<char>::push_back(&this->spelling,&local_45);
        }
        sVar16.begin = (this->spelling)._begin;
        sVar16.end = (this->spelling)._end;
        uVar6 = hashstring(sVar16,this->channel_hash);
        features::push_back((peVar3->super_example_predict).feature_space + 0x85,this->v,uVar6);
        uVar13 = (ulong)this->index;
      }
      ppvVar8 = this->namespace_dictionaries[uVar13].
                super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppvVar10 = this->namespace_dictionaries[uVar13].
                 super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppvVar10 != ppvVar8) {
        for (uVar13 = 0; uVar13 < (ulong)((long)ppvVar10 - (long)ppvVar8 >> 3); uVar13 = uVar13 + 1)
        {
          this_00 = ppvVar8[uVar13];
          uVar6 = uniform_hash(local_40.begin,(long)local_40.end - (long)local_40.begin,0x1aa5cfd);
          ppfVar9 = v_hashmap<substring,_features_*>::get(this_00,&local_40,uVar6);
          pfVar4 = *ppfVar9;
          if (pfVar4 != (features *)0x0) {
            _begin_00 = (pfVar4->values)._begin;
            pfVar12 = (pfVar4->values)._end;
            if (pfVar12 != _begin_00) {
              peVar3 = this->ae;
              if ((peVar3->super_example_predict).feature_space[0x87].values._end ==
                  (peVar3->super_example_predict).feature_space[0x87].values._begin) {
                v_array<unsigned_char>::push_back
                          ((v_array<unsigned_char> *)peVar3,&dictionary_namespace);
                _begin_00 = (pfVar4->values)._begin;
                pfVar12 = (pfVar4->values)._end;
              }
              push_many<float>(&(peVar3->super_example_predict).feature_space[0x87].values,_begin_00
                               ,(long)pfVar12 - (long)_begin_00 >> 2);
              _begin = (pfVar4->indicies)._begin;
              push_many<unsigned_long>
                        (&(peVar3->super_example_predict).feature_space[0x87].indicies,_begin,
                         (long)(pfVar4->indicies)._end - (long)_begin >> 3);
              (peVar3->super_example_predict).feature_space[0x87].sum_feat_sq =
                   pfVar4->sum_feat_sq +
                   (peVar3->super_example_predict).feature_space[0x87].sum_feat_sq;
            }
          }
          ppvVar8 = this->namespace_dictionaries[this->index].
                    super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppvVar10 = this->namespace_dictionaries[this->index].
                     super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
    }
  }
  return;
}

Assistant:

inline void maybeFeature()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
    {
      // maybeFeature --> ø
    }
    else
    {
      // maybeFeature --> 'String' FeatureValue
      substring feature_name = read_name();
      v = cur_channel_v * featureValue();
      uint64_t word_hash;
      if (feature_name.end != feature_name.begin)
        word_hash = (p->hasher(feature_name, channel_hash) & parse_mask);
      else
        word_hash = channel_hash + anon++;
      if (v == 0)
        return;  // dont add 0 valued features to list of features
      features& fs = ae->feature_space[index];
      fs.push_back(v, word_hash);
      if (audit)
      {
        v_array<char> feature_v = v_init<char>();
        push_many(feature_v, feature_name.begin, feature_name.end - feature_name.begin);
        feature_v.push_back('\0');
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(base, feature_v.begin())));
        feature_v.delete_v();
      }
      if ((affix_features[index] > 0) && (feature_name.end != feature_name.begin))
      {
        features& affix_fs = ae->feature_space[affix_namespace];
        if (affix_fs.size() == 0)
          ae->indices.push_back(affix_namespace);
        uint64_t affix = affix_features[index];
        while (affix > 0)
        {
          bool is_prefix = affix & 0x1;
          uint64_t len = (affix >> 1) & 0x7;
          substring affix_name = {feature_name.begin, feature_name.end};
          if (affix_name.end > affix_name.begin + len)
          {
            if (is_prefix)
              affix_name.end = affix_name.begin + len;
            else
              affix_name.begin = affix_name.end - len;
          }
          word_hash =
              p->hasher(affix_name, (uint64_t)channel_hash) * (affix_constant + (affix & 0xF) * quadratic_constant);
          affix_fs.push_back(v, word_hash);
          if (audit)
          {
            v_array<char> affix_v = v_init<char>();
            if (index != ' ')
              affix_v.push_back(index);
            affix_v.push_back(is_prefix ? '+' : '-');
            affix_v.push_back('0' + (char)len);
            affix_v.push_back('=');
            push_many(affix_v, affix_name.begin, affix_name.end - affix_name.begin);
            affix_v.push_back('\0');
            affix_fs.space_names.push_back(audit_strings_ptr(new audit_strings("affix", affix_v.begin())));
          }
          affix >>= 4;
        }
      }
      if (spelling_features[index])
      {
        features& spell_fs = ae->feature_space[spelling_namespace];
        if (spell_fs.size() == 0)
          ae->indices.push_back(spelling_namespace);
        // v_array<char> spelling;
        spelling.clear();
        for (char* c = feature_name.begin; c != feature_name.end; ++c)
        {
          char d = 0;
          if ((*c >= '0') && (*c <= '9'))
            d = '0';
          else if ((*c >= 'a') && (*c <= 'z'))
            d = 'a';
          else if ((*c >= 'A') && (*c <= 'Z'))
            d = 'A';
          else if (*c == '.')
            d = '.';
          else
            d = '#';
          // if ((spelling.size() == 0) || (spelling.last() != d))
          spelling.push_back(d);
        }
        substring spelling_ss = {spelling.begin(), spelling.end()};
        uint64_t word_hash = hashstring(spelling_ss, (uint64_t)channel_hash);
        spell_fs.push_back(v, word_hash);
        if (audit)
        {
          v_array<char> spelling_v = v_init<char>();
          if (index != ' ')
          {
            spelling_v.push_back(index);
            spelling_v.push_back('_');
          }
          push_many(spelling_v, spelling_ss.begin, spelling_ss.end - spelling_ss.begin);
          spelling_v.push_back('\0');
          spell_fs.space_names.push_back(audit_strings_ptr(new audit_strings("spelling", spelling_v.begin())));
        }
      }
      if (namespace_dictionaries[index].size() > 0)
      {
        for (size_t dict = 0; dict < namespace_dictionaries[index].size(); dict++)
        {
          feature_dict* map = namespace_dictionaries[index][dict];
          uint64_t hash = uniform_hash(feature_name.begin, feature_name.end - feature_name.begin, quadratic_constant);
          features* feats = map->get(feature_name, hash);
          if ((feats != nullptr) && (feats->values.size() > 0))
          {
            features& dict_fs = ae->feature_space[dictionary_namespace];
            if (dict_fs.size() == 0)
              ae->indices.push_back(dictionary_namespace);
            push_many(dict_fs.values, feats->values.begin(), feats->values.size());
            push_many(dict_fs.indicies, feats->indicies.begin(), feats->indicies.size());
            dict_fs.sum_feat_sq += feats->sum_feat_sq;
            if (audit)
              for (size_t i = 0; i < feats->indicies.size(); ++i)
              {
                uint64_t id = feats->indicies[i];
                stringstream ss;
                ss << index << '_';
                for (char* fc = feature_name.begin; fc != feature_name.end; ++fc) ss << *fc;
                ss << '=' << id;
                dict_fs.space_names.push_back(audit_strings_ptr(new audit_strings("dictionary", ss.str())));
              }
          }
        }
      }
    }
  }